

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.cpp
# Opt level: O1

void __thiscall Js::Utf8SourceInfo::EnsureInitialized(Utf8SourceInfo *this,int initialFunctionCount)

{
  Type *addr;
  Recycler *this_00;
  code *pcVar1;
  bool bVar2;
  ThreadContext *pTVar3;
  Recycler *pRVar4;
  SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *this_01;
  undefined4 *puVar5;
  SynchronizedDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *this_02;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  pTVar3 = ThreadContext::GetContextForCurrentThread();
  this_00 = pTVar3->recycler;
  if ((this->functionBodyDictionary).ptr ==
      (SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
       *)0x0) {
    addr = &this->functionBodyDictionary;
    local_68 = (undefined1  [8])
               &JsUtil::
                SynchronizedDictionary<unsigned_int,Js::FunctionBody*,Memory::RecyclerLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,Js::DefaultContainerLockPolicy,CriticalSection>
                ::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_3260db0;
    data.filename._0_4_ = 0xb3;
    pRVar4 = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_68);
    this_01 = (SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
               *)new<Memory::Recycler>(0x40,pRVar4,0x38bbb2);
    data._32_8_ = &pTVar3->csFunctionBody;
    JsUtil::
    BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary((BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      *)this_01,this_00,initialFunctionCount);
    this_01->syncObj = (Type)data._32_8_;
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = this_01;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  if ((DAT_015ad2eb == '\x01') && ((this->field_0xa8 & 1) == 0)) {
    if ((this->m_deferredFunctionsDictionary).ptr !=
        (SynchronizedDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
         *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
                                  ,0xb8,"(this->m_deferredFunctionsDictionary == nullptr)",
                                  "this->m_deferredFunctionsDictionary == nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    local_68 = (undefined1  [8])
               &JsUtil::
                SynchronizedDictionary<unsigned_int,Js::ParseableFunctionInfo*,Memory::RecyclerLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,Js::DefaultContainerLockPolicy,CriticalSection>
                ::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_3260db0;
    data.filename._0_4_ = 0xba;
    pRVar4 = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_68);
    this_02 = (SynchronizedDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
               *)new<Memory::Recycler>(0x40,pRVar4,0x38bbb2);
    JsUtil::
    BaseDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary((BaseDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      *)this_02,this_00,initialFunctionCount);
    this_02->syncObj = &pTVar3->csFunctionBody;
    Memory::Recycler::WBSetBit((char *)&this->m_deferredFunctionsDictionary);
    (this->m_deferredFunctionsDictionary).ptr = this_02;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->m_deferredFunctionsDictionary);
    this->field_0xa8 = this->field_0xa8 | 1;
  }
  return;
}

Assistant:

void Utf8SourceInfo::EnsureInitialized(int initialFunctionCount)
    {
        ThreadContext* threadContext = ThreadContext::GetContextForCurrentThread();
        Recycler* recycler = threadContext->GetRecycler();

        if (this->functionBodyDictionary == nullptr)
        {
            // This collection is allocated with leaf allocation policy. The references to the function body
            // here does not keep the function alive. However, the functions remove themselves at finalize
            // so if a function actually is in this map, it means that it is alive.
            this->functionBodyDictionary = RecyclerNew(recycler, FunctionBodyDictionary, recycler,
                initialFunctionCount, threadContext->GetFunctionBodyLock());
        }

        if (CONFIG_FLAG(DeferTopLevelTillFirstCall) && !m_deferredFunctionsInitialized)
        {
            Assert(this->m_deferredFunctionsDictionary == nullptr);
            this->m_deferredFunctionsDictionary = RecyclerNew(recycler, DeferredFunctionsDictionary, recycler,
                initialFunctionCount, threadContext->GetFunctionBodyLock());
            m_deferredFunctionsInitialized = true;
        }
    }